

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

void __thiscall
kratos::FSMState::next
          (FSMState *this,shared_ptr<kratos::FSMState> *next_state,shared_ptr<kratos::Var> *cond)

{
  element_type *peVar1;
  Var *ptr;
  FSM *pFVar2;
  bool bVar3;
  int iVar4;
  FSM *pFVar5;
  UserException *pUVar6;
  VarException *this_00;
  runtime_error *this_01;
  FSM *pFVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar8;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  initializer_list<const_kratos::IRNode_*> __l;
  Var *local_b0 [4];
  string local_90;
  anon_class_8_1_8991fb9c local_70;
  anon_class_8_1_8991fb9c find_match;
  allocator<char> local_2a;
  allocator_type local_29;
  
  peVar1 = (next_state->super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar1 == (element_type *)0x0) || (pFVar5 = peVar1->parent_, pFVar5 == (FSM *)0x0)) {
    pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
    find_match.this = (FSMState *)(this->parent_->fsm_name_)._M_dataplus._M_p;
    bVar8 = fmt::v7::to_string_view<char,_0>("Next state for {0}.{1} cannot be null");
    format_str.data_ = (char *)bVar8.size_;
    format_str.size_ = 0xdd;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&find_match;
    fmt::v7::detail::vformat_abi_cxx11_(&local_90,(detail *)bVar8.data_,format_str,args);
    UserException::UserException(pUVar6,&local_90);
    __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  pFVar2 = this->parent_;
  do {
    pFVar7 = pFVar2;
    pFVar2 = pFVar7->parent_fsm_;
  } while (pFVar7->parent_fsm_ != (FSM *)0x0);
  for (; (pFVar5 != (FSM *)0x0 && (pFVar5 != pFVar7)); pFVar5 = pFVar5->parent_fsm_) {
  }
  if (pFVar5 != pFVar7) {
    pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
    find_match.this =
         (FSMState *)
         (((next_state->super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
         name_)._M_dataplus._M_p;
    bVar8 = fmt::v7::to_string_view<char,_0>
                      ("FSM state {0} belongs to a different FSM {1} than {2}");
    format_str_00.data_ = (char *)bVar8.size_;
    format_str_00.size_ = 0xddd;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&find_match;
    fmt::v7::detail::vformat_abi_cxx11_(&local_90,(detail *)bVar8.data_,format_str_00,args_00);
    UserException::UserException(pUVar6,&local_90);
    __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  ptr = (cond->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70.this = this;
  if (ptr == (Var *)0x0) {
    find_match.this = (FSMState *)0x0;
    std::
    vector<std::pair<kratos::Var*,kratos::FSMState*>,std::allocator<std::pair<kratos::Var*,kratos::FSMState*>>>
    ::emplace_back<std::pair<decltype(nullptr),kratos::FSMState*>>
              ((vector<std::pair<kratos::Var*,kratos::FSMState*>,std::allocator<std::pair<kratos::Var*,kratos::FSMState*>>>
                *)&this->transitions_,(pair<std::nullptr_t,_kratos::FSMState_*> *)&find_match);
  }
  else {
    bVar3 = next::anon_class_8_1_8991fb9c::operator()(&local_70,(Var *)0x0);
    if (bVar3) {
      pUVar6 = (UserException *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &find_match,"Unconditional transition has been assign to ",&this->name_);
      UserException::UserException(pUVar6,(string *)&find_match);
      __cxa_throw(pUVar6,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar4 = (*(ptr->super_IRNode)._vptr_IRNode[7])(ptr);
    if (iVar4 != 1) {
      this_00 = (VarException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&find_match,"Condition has to be a boolean value",&local_2a);
      __l._M_len = 1;
      __l._M_array = (iterator)local_b0;
      local_b0[0] = ptr;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 &local_90,__l,&local_29);
      VarException::VarException
                (this_00,(string *)&find_match,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 &local_90);
      __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar3 = next::anon_class_8_1_8991fb9c::operator()(&local_70,ptr);
    if (bVar3) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      (*(ptr->super_IRNode)._vptr_IRNode[0x1f])(local_b0,ptr);
      find_match.this = (FSMState *)local_b0[0];
      bVar8 = fmt::v7::to_string_view<char,_0>("{0} has been added to FSM {1}-{2} already");
      format_str_01.data_ = (char *)bVar8.size_;
      format_str_01.size_ = 0xddd;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&find_match;
      fmt::v7::detail::vformat_abi_cxx11_(&local_90,(detail *)bVar8.data_,format_str_01,args_01);
      std::runtime_error::runtime_error(this_01,(string *)&local_90);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    find_match.this = (FSMState *)ptr;
    std::
    vector<std::pair<kratos::Var*,kratos::FSMState*>,std::allocator<std::pair<kratos::Var*,kratos::FSMState*>>>
    ::emplace_back<std::pair<kratos::Var*,kratos::FSMState*>>
              ((vector<std::pair<kratos::Var*,kratos::FSMState*>,std::allocator<std::pair<kratos::Var*,kratos::FSMState*>>>
                *)&this->transitions_,(pair<kratos::Var_*,_kratos::FSMState_*> *)&find_match);
  }
  return;
}

Assistant:

void FSMState::next(const std::shared_ptr<FSMState>& next_state, const std::shared_ptr<Var>& cond) {
    if (!next_state || !next_state->parent_)
        throw UserException(
            ::format("Next state for {0}.{1} cannot be null", parent_->fsm_name(), name_));
    // making sure that it's part of the same fsm state
    auto* parent = parent_;
    auto* state_ptr = next_state.get();
    while (parent->parent_fsm()) parent = parent->parent_fsm();
    auto* fsm = next_state->parent_;
    while (fsm && fsm != parent) {
        fsm = fsm->parent_fsm();
    }
    if (fsm != parent) {
        throw UserException(::format("FSM state {0} belongs to a different FSM {1} than {2}",
                                     next_state->name_, next_state->parent_->fsm_name(),
                                     parent->fsm_name()));
    }

    auto find_match = [this](Var *ptr) -> bool {
        auto it = std::find_if(transitions_.begin(), transitions_.end(), [ptr](auto const &pair) {
            return pair.first == ptr;
        });
        return it != transitions_.end();
    };

    if (!cond) {
        transitions_.emplace_back(std::make_pair(nullptr, state_ptr));
    } else {
        if (find_match(nullptr)) {
            // we have a slide through
            throw UserException("Unconditional transition has been assign to " + name_);
        }
        auto* ptr = cond.get();
        if (cond->width() != 1) throw VarException("Condition has to be a boolean value", {ptr});

        if (find_match(ptr)) {
            throw ::runtime_error(::format("{0} has been added to FSM {1}-{2} already",
                                           ptr->to_string(), parent_->fsm_name(), name_));
        }
        transitions_.emplace_back(std::make_pair(ptr, state_ptr));
    }
}